

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix3f.cpp
# Opt level: O0

void __thiscall Matrix3f::setCol(Matrix3f *this,int j,Vector3f *v)

{
  int iVar1;
  Vector3f *in_RDX;
  int in_ESI;
  long in_RDI;
  float fVar2;
  int colStart;
  
  iVar1 = in_ESI * 3;
  fVar2 = Vector3f::x(in_RDX);
  *(float *)(in_RDI + (long)iVar1 * 4) = fVar2;
  fVar2 = Vector3f::y(in_RDX);
  *(float *)(in_RDI + (long)(iVar1 + 1) * 4) = fVar2;
  fVar2 = Vector3f::z(in_RDX);
  *(float *)(in_RDI + (long)(iVar1 + 2) * 4) = fVar2;
  return;
}

Assistant:

void Matrix3f::setCol( int j, const Vector3f& v )
{
	int colStart = 3 * j;

	m_elements[ colStart ] = v.x();
	m_elements[ colStart + 1 ] = v.y();
	m_elements[ colStart + 2 ] = v.z();
}